

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindMinMax<duckdb::MinOperation,duckdb::MinOperationString,duckdb::MinOperationVector>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> oVar4;
  int iVar5;
  reference pvVar6;
  pointer pEVar7;
  DBConfig *pDVar8;
  idx_t offset;
  reference this_00;
  reference pvVar9;
  ParameterNotResolvedException *this_01;
  NotImplementedException *this_02;
  BinderException *this_03;
  InternalException *this_04;
  LogicalType *pLVar10;
  LogicalType *type;
  char *pcVar11;
  char *pcVar12;
  FunctionNullHandling in_R8B;
  ErrorData *error_00;
  long lVar13;
  FunctionSet<duckdb::AggregateFunction> *this_05;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  string function_name;
  LogicalType input_type;
  optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> func;
  ErrorData error;
  type name;
  optional_idx best_function;
  FunctionBinder function_binder;
  undefined1 local_2a0 [41];
  byte local_277;
  optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> local_260;
  undefined1 local_258 [128];
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  optional_idx local_198;
  FunctionBinder local_190;
  undefined1 local_180 [296];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2a0._32_8_ = context;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  if ((pEVar7->return_type).id_ == VARCHAR) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    StringType::GetCollation_abi_cxx11_(&local_1d8,(StringType *)&pEVar7->return_type,type);
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (pDVar8 = DBConfig::GetConfig((ClientContext *)local_2a0._32_8_),
       (pDVar8->options).collation._M_string_length == 0)) {
      bVar3 = true;
    }
    else {
      iVar5 = ::std::__cxx11::string::compare
                        ((char *)&(function->super_BaseScalarFunction).super_SimpleFunction.
                                  super_Function.name);
      pcVar12 = "arg_max";
      if (iVar5 == 0) {
        pcVar12 = "arg_min";
      }
      local_2a0._0_8_ = local_2a0 + 0x10;
      pcVar11 = "";
      if (iVar5 == 0) {
        pcVar11 = "";
      }
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,pcVar12,pcVar11);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,anon_var_dwarf_4f001a4 + 9);
      local_258._0_8_ = local_258 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,anon_var_dwarf_4f001a4 + 9);
      local_260 = Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                            ((ClientContext *)local_2a0._32_8_,(string *)local_180,
                             (string *)local_258,(string *)local_2a0,RETURN_NULL,
                             (QueryErrorContext)0xffffffffffffffff);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_);
      }
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
      if (local_260.ptr == (AggregateFunctionCatalogEntry *)0x0) {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_180._0_8_ = local_180 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_180,
                   "Failure while binding function \"%s\" using collations - arg_min/arg_max do not exist in the catalog - load the core_functions module to fix this issue"
                   ,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,
                   pcVar2 + (function->super_BaseScalarFunction).super_SimpleFunction.super_Function
                            .name._M_string_length);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_02,(string *)local_180,&local_50);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::CheckValid(&local_260);
      oVar4.ptr = local_260.ptr;
      FunctionBinder::FunctionBinder(&local_190,(ClientContext *)local_2a0._32_8_);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      LogicalType::LogicalType((LogicalType *)local_180,&pEVar7->return_type);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      LogicalType::LogicalType((LogicalType *)(local_180 + 0x18),&pEVar7->return_type);
      __l._M_len = 2;
      __l._M_array = (iterator)local_180;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_2a0 + 0x28),__l,(allocator_type *)local_258);
      lVar13 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_180 + lVar13));
        lVar13 = lVar13 + -0x18;
      } while (lVar13 != -0x18);
      ErrorData::ErrorData((ErrorData *)local_258);
      this_05 = (FunctionSet<duckdb::AggregateFunction> *)((long)oVar4.ptr + 0x158);
      error_00 = (ErrorData *)local_258;
      local_198 = FunctionBinder::BindFunction
                            (&local_190,(string *)((long)oVar4.ptr + 0x20),
                             (AggregateFunctionSet *)this_05,
                             (vector<duckdb::LogicalType,_true> *)(local_2a0 + 0x28),error_00);
      in_R8B = (FunctionNullHandling)error_00;
      if (local_198.index == 0xffffffffffffffff) {
        this_03 = (BinderException *)__cxa_allocate_exception(0x10);
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b8,
                   "Fail to find corresponding function for collation min/max: ","");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_180,&local_1b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_258 + 0x28));
        BinderException::BinderException(this_03,(string *)local_180);
        __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      offset = optional_idx::GetIndex(&local_198);
      FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
                ((AggregateFunction *)local_180,this_05,offset);
      AggregateFunction::operator=(function,(AggregateFunction *)local_180);
      local_180._0_8_ = &PTR__AggregateFunction_02476990;
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_180);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0x11])(local_180,pEVar7);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)arguments,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_180);
      if ((undefined **)local_180._0_8_ != (undefined **)0x0) {
        (**(code **)(*(undefined **)local_180._0_8_ + 8))();
      }
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      ExpressionBinder::PushCollation
                ((ClientContext *)local_2a0._32_8_,pvVar6,&pEVar7->return_type,ALL_COLLATIONS);
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                         (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
      if (pvVar9 != &pEVar7->return_type) {
        pvVar9->id_ = (pEVar7->return_type).id_;
        pvVar9->physical_type_ = (pEVar7->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar9->type_info_,&(pEVar7->return_type).type_info_);
      }
      pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      if (&(function->super_BaseScalarFunction).return_type != &pEVar7->return_type) {
        (function->super_BaseScalarFunction).return_type.id_ = (pEVar7->return_type).id_;
        (function->super_BaseScalarFunction).return_type.physical_type_ =
             (pEVar7->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(function->super_BaseScalarFunction).return_type.type_info_,
                   &(pEVar7->return_type).type_info_);
      }
      *(undefined8 *)this = 0;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_258 + 0x48));
      if ((undefined1 *)local_258._40_8_ != local_258 + 0x38) {
        operator_delete((void *)local_258._40_8_);
      }
      if ((undefined1 *)local_258._8_8_ != local_258 + 0x18) {
        operator_delete((void *)local_258._8_8_);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_2a0 + 0x28));
      if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
        operator_delete((void *)local_2a0._0_8_);
      }
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (!bVar3) {
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  LogicalType::LogicalType((LogicalType *)(local_2a0 + 0x28),&pEVar7->return_type);
  if (local_2a0[0x28] == '\x02') {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  local_1d8._M_dataplus._M_p =
       (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_dataplus.
       _M_p;
  paVar1 = &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == paVar1) {
    local_1d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1d8.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                  field_2 + 8);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_1d8._M_string_length =
       (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
       _M_string_length;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)paVar1;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name._M_string_length = 0
  ;
  (function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.field_2._M_local_buf
  [0] = '\0';
  pLVar10 = (LogicalType *)local_1d8._M_string_length;
  if ((local_277 < 0x1e) &&
     (pLVar10 = (LogicalType *)0x21800000, (0x21800000U >> (local_277 & 0x1f) & 1) != 0)) {
    LogicalType::LogicalType((LogicalType *)local_2a0,(LogicalType *)(local_2a0 + 0x28));
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_2a0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_258,__l_00
               ,(allocator_type *)&local_190);
    LogicalType::LogicalType((LogicalType *)&local_1b8,BLOB);
    AggregateFunction::AggregateFunction
              ((AggregateFunction *)local_180,(vector<duckdb::LogicalType,_true> *)local_258,
               (LogicalType *)&local_1b8,AggregateFunction::StateSize<duckdb::MinMaxStringState>,
               AggregateFunction::
               StateInitialize<duckdb::MinMaxStringState,duckdb::MinOperationVector,(duckdb::AggregateDestructorType)0>
               ,AggregateSortKeyHelpers::
                UnaryUpdate<duckdb::MinMaxStringState,duckdb::MinOperationVector,(duckdb::OrderType)2,false>
               ,AggregateFunction::
                StateCombine<duckdb::MinMaxStringState,duckdb::MinOperationVector>,
               AggregateFunction::
               StateVoidFinalize<duckdb::MinMaxStringState,duckdb::MinOperationVector>,
               (aggregate_simple_update_t)0x0,VectorMinMaxBase<(duckdb::OrderType)2>::Bind,
               AggregateFunction::StateDestroy<duckdb::MinMaxStringState,duckdb::MinOperationVector>
               ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
               (aggregate_deserialize_t)0x0);
    LogicalType::~LogicalType((LogicalType *)&local_1b8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_258);
  }
  else {
    if (local_277 == 200) {
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)(local_2a0 + 0x28));
      LogicalType::LogicalType((LogicalType *)local_2a0,(LogicalType *)(local_2a0 + 0x28));
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::MinMaxStringState,duckdb::string_t,duckdb::string_t,duckdb::MinOperationString,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_258,
                 (LogicalType *)local_2a0,pLVar10);
      LogicalType::~LogicalType((LogicalType *)local_2a0);
      pLVar10 = (LogicalType *)local_258;
      goto LAB_00ee6860;
    }
    LogicalType::LogicalType((LogicalType *)local_2a0,(LogicalType *)(local_2a0 + 0x28));
    switch(local_2a0[1]) {
    case BOOL:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<signed_char>,signed_char,signed_char,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case UINT8:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_char>,unsigned_char,unsigned_char,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case INT8:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<signed_char>,signed_char,signed_char,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case UINT16:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_short>,unsigned_short,unsigned_short,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case INT16:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<short>,short,short,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case UINT32:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_int>,unsigned_int,unsigned_int,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case INT32:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<int>,int,int,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case UINT64:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<unsigned_long>,unsigned_long,unsigned_long,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case INT64:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<long>,long,long,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case UINT64|UINT8:
    case DOUBLE|BOOL:
    case DOUBLE|UINT8:
    case DOUBLE|INT8:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
switchD_00ee6590_caseD_a:
      this_04 = (InternalException *)__cxa_allocate_exception(0x10);
      local_258._0_8_ = local_258 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,"Unimplemented type for min/max aggregate","");
      InternalException::InternalException(this_04,(string *)local_258);
      __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<float>,float,float,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case DOUBLE:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<double>,double,double,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    case INTERVAL:
      LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
      AggregateFunction::
      UnaryAggregate<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::interval_t,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                 (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      break;
    default:
      if (local_2a0[1] == UINT128) {
        LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
        AggregateFunction::
        UnaryAggregate<duckdb::MinMaxState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                   (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      }
      else {
        if (local_2a0[1] != INT128) goto switchD_00ee6590_caseD_a;
        LogicalType::LogicalType((LogicalType *)local_258,(LogicalType *)local_2a0);
        AggregateFunction::
        UnaryAggregate<duckdb::MinMaxState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MinOperation,(duckdb::AggregateDestructorType)0>
                  ((AggregateFunction *)local_180,(AggregateFunction *)local_2a0,
                   (LogicalType *)local_258,(LogicalType *)0x0,in_R8B);
      }
    }
    LogicalType::~LogicalType((LogicalType *)local_258);
  }
  pLVar10 = (LogicalType *)local_2a0;
LAB_00ee6860:
  LogicalType::~LogicalType(pLVar10);
  AggregateFunction::operator=(function,(AggregateFunction *)local_180);
  local_180._0_8_ = &PTR__AggregateFunction_02476990;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_180);
  ::std::__cxx11::string::operator=
            ((string *)
             &(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,
             (string *)&local_1d8);
  function->order_dependent = NOT_ORDER_DEPENDENT;
  function->distinct_dependent = NOT_DISTINCT_DEPENDENT;
  if (function->bind == (bind_aggregate_function_t)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    (*function->bind)((ClientContext *)this,(AggregateFunction *)local_2a0._32_8_,
                      (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       *)function);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  LogicalType::~LogicalType((LogicalType *)(local_2a0 + 0x28));
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindMinMax(ClientContext &context, AggregateFunction &function,
                                    vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->return_type.id() == LogicalTypeId::VARCHAR) {
		auto str_collation = StringType::GetCollation(arguments[0]->return_type);
		if (!str_collation.empty() || !DBConfig::GetConfig(context).options.collation.empty()) {
			// If aggr function is min/max and uses collations, replace bound_function with arg_min/arg_max
			// to make sure the result's correctness.
			string function_name = function.name == "min" ? "arg_min" : "arg_max";
			QueryErrorContext error_context;
			auto func = Catalog::GetEntry<AggregateFunctionCatalogEntry>(context, "", "", function_name,
			                                                             OnEntryNotFound::RETURN_NULL, error_context);
			if (!func) {
				throw NotImplementedException(
				    "Failure while binding function \"%s\" using collations - arg_min/arg_max do not exist in the "
				    "catalog - load the core_functions module to fix this issue",
				    function.name);
			}

			auto &func_entry = *func;

			FunctionBinder function_binder(context);
			vector<LogicalType> types {arguments[0]->return_type, arguments[0]->return_type};
			ErrorData error;
			auto best_function = function_binder.BindFunction(func_entry.name, func_entry.functions, types, error);
			if (!best_function.IsValid()) {
				throw BinderException(string("Fail to find corresponding function for collation min/max: ") +
				                      error.Message());
			}
			function = func_entry.functions.GetFunctionByOffset(best_function.GetIndex());

			// Create a copied child and PushCollation for it.
			arguments.push_back(arguments[0]->Copy());
			ExpressionBinder::PushCollation(context, arguments[1], arguments[0]->return_type);

			// Bind function like arg_min/arg_max.
			function.arguments[0] = arguments[0]->return_type;
			function.return_type = arguments[0]->return_type;
			return nullptr;
		}
	}

	auto input_type = arguments[0]->return_type;
	if (input_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	auto name = std::move(function.name);
	function = GetMinMaxOperator<OP, OP_STRING, OP_VECTOR>(input_type);
	function.name = std::move(name);
	function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	function.distinct_dependent = AggregateDistinctDependent::NOT_DISTINCT_DEPENDENT;
	if (function.bind) {
		return function.bind(context, function, arguments);
	} else {
		return nullptr;
	}
}